

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void n_number_suite::n_number_minus_1_dot_0_dot(void)

{
  char input [8];
  reader reader;
  undefined8 local_178;
  view_type local_170;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160,"[-1.0.]",8);
  local_170._M_len = strlen(local_160);
  local_170._M_str = local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_178._0_4_ = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x3a8,"void n_number_suite::n_number_minus_1_dot_0_dot()",&local_170,&local_178);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_178 = CONCAT44(local_178._4_4_,9);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x3aa,"void n_number_suite::n_number_minus_1_dot_0_dot()",&local_170,&local_178);
  local_170._M_len = (size_t)trial::protocol::json::basic_reader<char>::value<double>(&local_158);
  local_178 = 0xbff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<double>()","-1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x3ab,"void n_number_suite::n_number_minus_1_dot_0_dot()",&local_170,&local_178);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_178 = CONCAT44(local_178._4_4_,0xfffffff9);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_expected_end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x3ad,"void n_number_suite::n_number_minus_1_dot_0_dot()",&local_170,&local_178);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void n_number_minus_1_dot_0_dot()
{
    const char input[] = "[-1.0.]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<double>(), -1.0);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_expected_end_array);
}